

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<wchar_t,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<wchar_t,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  uint uVar2;
  num_writer f;
  uint uVar3;
  string_view prefix;
  string groups;
  undefined4 uStack_5c;
  undefined2 *local_30;
  undefined8 local_28;
  undefined2 local_20 [8];
  
  local_20[0] = 3;
  local_28 = 1;
  cVar1 = this->specs->thousands;
  local_30 = local_20;
  if (cVar1 == '\0') {
    on_dec(this);
  }
  else {
    uVar2 = this->abs_value;
    uVar3 = 0x1f;
    if ((uVar2 | 1) != 0) {
      for (; (uVar2 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uVar3 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    uVar3 = (uVar3 + 1) -
            (uint)(uVar2 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar3 * 4));
    if (3 < uVar3) {
      uVar3 = uVar3 + (uVar3 - 4 & 0xff) / 3 + 1;
    }
    prefix.data_ = this->prefix;
    f._20_4_ = uStack_5c;
    f.sep = (int)cVar1;
    f.size = uVar3;
    f.abs_value = uVar2;
    f.groups = (string *)&local_30;
    prefix.size_._0_4_ = this->prefix_size;
    prefix.size_._4_4_ = 0;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<wchar_t,duckdb_fmt::v6::basic_format_specs<wchar_t>>::num_writer>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this->writer,uVar3,prefix,
               *this->specs,f);
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }